

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

void player_regen_mana(player *p)

{
  uint32_t *puVar1;
  bitflag *flags;
  short sVar2;
  _Bool _Var3;
  int iVar4;
  int32_t iVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  
  sVar2 = p->csp;
  flags = (p->state).pflags;
  _Var3 = flag_has_dbg(flags,10,0x23,"p->state.pflags","(PF_COMBAT_REGEN)");
  if ((!_Var3) ||
     (uVar7 = 0xc5, p->chp <= (short)((uint)(int)(short)(p->mhp - (p->mhp >> 0xf)) >> 1))) {
    _Var3 = player_of_has(p,L'\f');
    iVar6 = 0xc5;
    if (_Var3) {
      iVar6 = 0x18a;
    }
    bVar8 = true;
    if (player_turns_rested < L'\x05') {
      bVar8 = (~p->upkeep->resting & 0xfffcU) == 0;
    }
    _Var3 = flag_has_dbg(flags,10,0x4b,"p->state.pflags","(PF_MEDITATION)");
    uVar7 = (iVar6 << bVar8) << _Var3;
  }
  _Var3 = flag_has_dbg(flags,10,0x23,"p->state.pflags","(PF_COMBAT_REGEN)");
  if (_Var3) {
    uVar7 = -(uVar7 >> 1);
  }
  else {
    _Var3 = player_of_has(p,L'\x1b');
    uVar7 = uVar7 >> _Var3;
  }
  iVar4 = (int)p->msp * uVar7;
  iVar6 = iVar4 + 0x20c;
  if ((int)uVar7 < 0) {
    iVar6 = iVar4;
  }
  iVar5 = player_adjust_mana_precise(p,iVar6);
  if (iVar5 < 0) {
    _Var3 = flag_has_dbg(flags,10,0x23,"p->state.pflags","(PF_COMBAT_REGEN)");
    if (_Var3) {
      convert_mana_to_hp(p,iVar5 * -2);
    }
  }
  if (sVar2 == p->csp) {
    return;
  }
  puVar1 = &p->upkeep->redraw;
  *puVar1 = *puVar1 | 0x80;
  equip_learn_flag(p,L'\f');
  equip_learn_flag(p,L'\x1b');
  return;
}

Assistant:

void player_regen_mana(struct player *p)
{
	int32_t sp_gain;
	int percent, old_csp = p->csp;

	/* Save the old spell points */
	old_csp = p->csp;

	/* Default regeneration */
	percent = PY_REGEN_NORMAL;

	/* Various things speed up regeneration, but shouldn't punish healthy BGs */
	if (!(player_has(p, PF_COMBAT_REGEN) && p->chp  > p->mhp / 2)) {
		if (player_of_has(p, OF_REGEN))
			percent *= 2;
		if (player_resting_can_regenerate(p))
			percent *= 2;
		if (player_has(p, PF_MEDITATION))
			percent *= 2;
	}

	/* Some things slow it down */
	if (player_has(p, PF_COMBAT_REGEN)) {
		percent /= -2;
	} else if (player_of_has(p, OF_IMPAIR_MANA)) {
		percent /= 2;
	}

	/* Regenerate mana */
	sp_gain = (int32_t)(p->msp * percent);
	if (percent >= 0)
		sp_gain += PY_REGEN_MNBASE;
	sp_gain = player_adjust_mana_precise(p, sp_gain);

	/* SP degen heals BGs at double efficiency vs casting */
	if (sp_gain < 0  && player_has(p, PF_COMBAT_REGEN)) {
		convert_mana_to_hp(p, -sp_gain * 2);
	}

	/* Notice changes */
	if (old_csp != p->csp) {
		p->upkeep->redraw |= (PR_MANA);
		equip_learn_flag(p, OF_REGEN);
		equip_learn_flag(p, OF_IMPAIR_MANA);
	}
}